

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

void __thiscall ON_String::Destroy(ON_String *this)

{
  ON_Internal_Empty_aString *hdr;
  
  hdr = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  if ((hdr != &empty_astring && this->m_s != (char *)0x0) &&
     (0 < (hdr->header).ref_count.super___atomic_base<int>._M_i)) {
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero((ON_aStringHeader *)hdr);
  }
  this->m_s = (char *)0x849344;
  return;
}

Assistant:

void ON_String::Destroy()
{
  ON_aStringHeader* hdr = Header();
  if (hdr != pEmptyStringHeader && nullptr != hdr && (int)(hdr->ref_count) > 0)
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
	Create();
}